

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::TestOutputStream::~TestOutputStream(TestOutputStream *this)

{
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR__TestOutputStream_0035ad58;
  std::__cxx11::string::~string((string *)&this->data);
  kj::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)this);
  return;
}

Assistant:

~TestOutputStream() {}